

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall libserver::server::server(server *this)

{
  ptime pVar1;
  server *this_local;
  
  boost::enable_shared_from_this<libserver::server>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libserver::server>);
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_socket<boost::asio::io_context>(&this->socket,&io_service,(type *)0x0);
  std::__cxx11::string::string((string *)&this->client_name);
  boost::posix_time::ptime::ptime(&this->_ping);
  this->_is_reading = false;
  this->_num_bytes_read = 0;
  pVar1 = boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
  (this->_ping).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type)
       pVar1.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  return;
}

Assistant:

libserver::server::server() : socket(io_service)
{
    _is_reading = false;
    _num_bytes_read = 0;
    _ping = boost::posix_time::microsec_clock::local_time();
}